

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_free(ptls_t *tls)

{
  _func_int_st_ptls_key_exchange_context_t_ptr_ptr_int_ptls_iovec_t_ptr_ptls_iovec_t *p_Var1;
  _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *p_Var2;
  void *pvVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ptls_log_conn_state_t *conn;
  ptls_iovec_t pVar6;
  ptls_iovec_t pVar7;
  int local_2c;
  int ptlslog_include_appdata;
  ptls_log_conn_state_t *conn_state;
  ptls_t *_tls;
  uint32_t active;
  ptls_t *tls_local;
  
  uVar4 = ptls_log_point_maybe_active(&ptls_free::logpoint);
  if (uVar4 != 0) {
    conn = ptls_get_log_state(tls);
    uVar5 = ptls_log_conn_maybe_active(conn,ptls_get_server_name,tls);
    if ((uVar5 & uVar4) != 0) {
      local_2c = 0;
      do {
        ptls_log__do_write_start(&ptls_free::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        local_2c = ptls_log__do_write_end
                             (&ptls_free::logpoint,conn,ptls_get_server_name,tls,local_2c);
      } while (local_2c != 0);
    }
  }
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  ptls_buffer_dispose(&(tls->recvbuf).mess);
  free_exporter_master_secret(tls,1);
  free_exporter_master_secret(tls,0);
  if (tls->key_schedule != (ptls_key_schedule_t *)0x0) {
    key_schedule_free(tls->key_schedule);
  }
  if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
    ptls_aead_free((tls->traffic_protection).dec.aead);
  }
  if ((tls->traffic_protection).enc.aead != (ptls_aead_context_t *)0x0) {
    ptls_aead_free((tls->traffic_protection).enc.aead);
  }
  free(tls->server_name);
  free(tls->negotiated_protocol);
  clear_ech(&tls->ech,(uint)(tls->field_0x1e8 & 1));
  if ((tls->field_0x1e8 & 1) == 0) {
    if ((tls->field_19).client.key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
      p_Var1 = ((tls->field_19).client.key_share_ctx)->on_exchange;
      pVar6 = ptls_iovec_init((void *)0x0,0);
      (*p_Var1)(&(tls->field_19).client.key_share_ctx,1,(ptls_iovec_t *)0x0,pVar6);
    }
    if ((tls->field_19).client.certificate_request.context.base != (uint8_t *)0x0) {
      free((tls->field_19).client.certificate_request.context.base);
    }
  }
  else if ((tls->field_19).client.certificate_request.context.len != 0) {
    (*((tls->field_19).server.async_job)->destroy_)((tls->field_19).server.async_job);
  }
  if ((tls->certificate_verify).cb != (_func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *)0x0)
  {
    p_Var2 = (tls->certificate_verify).cb;
    pvVar3 = (tls->certificate_verify).verify_ctx;
    pVar6 = ptls_iovec_init((void *)0x0,0);
    pVar7 = ptls_iovec_init((void *)0x0,0);
    (*p_Var2)(pvVar3,0,pVar6,pVar7);
  }
  if (tls->pending_handshake_secret != (uint8_t *)0x0) {
    (*ptls_clear_memory)(tls->pending_handshake_secret,0x40);
    free(tls->pending_handshake_secret);
  }
  update_open_count(tls->ctx,-1);
  (*ptls_clear_memory)(tls,0x2b8);
  free(tls);
  return;
}

Assistant:

void ptls_free(ptls_t *tls)
{
    PTLS_PROBE0(FREE, tls);
    PTLS_LOG_CONN(free, tls, {});

    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_buffer_dispose(&tls->recvbuf.mess);
    free_exporter_master_secret(tls, 1);
    free_exporter_master_secret(tls, 0);
    if (tls->key_schedule != NULL)
        key_schedule_free(tls->key_schedule);
    if (tls->traffic_protection.dec.aead != NULL)
        ptls_aead_free(tls->traffic_protection.dec.aead);
    if (tls->traffic_protection.enc.aead != NULL)
        ptls_aead_free(tls->traffic_protection.enc.aead);
    free(tls->server_name);
    free(tls->negotiated_protocol);
    clear_ech(&tls->ech, tls->is_server);
    if (tls->is_server) {
        if (tls->server.async_job != NULL)
            tls->server.async_job->destroy_(tls->server.async_job);
    } else {
        if (tls->client.key_share_ctx != NULL)
            tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        if (tls->client.certificate_request.context.base != NULL)
            free(tls->client.certificate_request.context.base);
    }
    if (tls->certificate_verify.cb != NULL)
        tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, 0, ptls_iovec_init(NULL, 0), ptls_iovec_init(NULL, 0));
    if (tls->pending_handshake_secret != NULL) {
        ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
        free(tls->pending_handshake_secret);
    }
    update_open_count(tls->ctx, -1);
    ptls_clear_memory(tls, sizeof(*tls));
    free(tls);
}